

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWvidmode *pGVar2;
  GLFWwindow *handle;
  double t;
  GLFWvidmode *mode;
  GLFWmonitor *monitor;
  GLFWwindow *window;
  thrd_t physics_thread;
  int local_20;
  int height;
  int width;
  int ch;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  window = (GLFWwindow *)0x0;
  mode = (GLFWvidmode *)0x0;
  _width = argv;
  argv_local._0_4_ = argc;
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    fprintf(_stderr,"Failed to initialize GLFW\n");
    exit(1);
  }
  while (height = getopt((int)argv_local,_width,"fh"), height != -1) {
    if (height == 0x66) {
      mode = (GLFWvidmode *)glfwGetPrimaryMonitor();
    }
    else if (height == 0x68) {
      usage();
      exit(0);
    }
  }
  if (mode == (GLFWvidmode *)0x0) {
    local_20 = 0x280;
    physics_thread._4_4_ = 0x1e0;
  }
  else {
    pGVar2 = glfwGetVideoMode((GLFWmonitor *)mode);
    glfwWindowHint(0x21001,pGVar2->redBits);
    glfwWindowHint(0x21002,pGVar2->greenBits);
    glfwWindowHint(0x21003,pGVar2->blueBits);
    glfwWindowHint(0x2100f,pGVar2->refreshRate);
    local_20 = pGVar2->width;
    physics_thread._4_4_ = pGVar2->height;
  }
  handle = glfwCreateWindow(local_20,physics_thread._4_4_,"Particle Engine",(GLFWmonitor *)mode,
                            (GLFWwindow *)0x0);
  if (handle != (GLFWwindow *)0x0) {
    if (mode != (GLFWvidmode *)0x0) {
      glfwSetInputMode(handle,0x33001,0x34003);
    }
    glfwMakeContextCurrent(handle);
    gladLoadGLLoader(glfwGetProcAddress);
    glfwSwapInterval(1);
    glfwSetFramebufferSizeCallback(handle,resize_callback);
    glfwSetKeyCallback(handle,key_callback);
    glfwGetFramebufferSize(handle,&local_20,(int *)((long)&physics_thread + 4));
    resize_callback(handle,local_20,physics_thread._4_4_);
    (*glad_glGenTextures)(1,&particle_tex_id);
    (*glad_glBindTexture)(0xde1,particle_tex_id);
    (*glad_glPixelStorei)(0xcf5,1);
    (*glad_glTexParameteri)(0xde1,0x2802,0x2900);
    (*glad_glTexParameteri)(0xde1,0x2803,0x2900);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
    (*glad_glTexImage2D)(0xde1,0,0x1909,8,8,0,0x1909,0x1401,"");
    (*glad_glGenTextures)(1,&floor_tex_id);
    (*glad_glBindTexture)(0xde1,floor_tex_id);
    (*glad_glPixelStorei)(0xcf5,1);
    (*glad_glTexParameteri)(0xde1,0x2802,0x2901);
    (*glad_glTexParameteri)(0xde1,0x2803,0x2901);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
    (*glad_glTexImage2D)(0xde1,0,0x1909,0x10,0x10,0,0x1909,0x1401,floor_texture);
    iVar1 = glfwExtensionSupported("GL_EXT_separate_specular_color");
    if (iVar1 != 0) {
      (*glad_glLightModeli)(0x81f8,0x81fa);
    }
    (*glad_glPolygonMode)(0x408,0x1b02);
    wireframe = 0;
    thread_sync.t = 0.0;
    thread_sync.dt = 0.001;
    thread_sync.p_frame = 0;
    thread_sync.d_frame = 0;
    mtx_init(&thread_sync.particles_lock,2);
    cnd_init(&thread_sync.p_done);
    cnd_init(&thread_sync.d_done);
    iVar1 = thrd_create((thrd_t *)&window,physics_thread_main,handle);
    if (iVar1 == 1) {
      glfwSetTime(0.0);
      while (iVar1 = glfwWindowShouldClose(handle), iVar1 == 0) {
        t = glfwGetTime();
        draw_scene(handle,t);
        glfwSwapBuffers(handle);
        glfwPollEvents();
      }
      thrd_join((thrd_t)window,(int *)0x0);
      glfwDestroyWindow(handle);
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
    exit(1);
  }
  fprintf(_stderr,"Failed to create GLFW window\n");
  glfwTerminate();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, width, height;
    thrd_t physics_thread = 0;
    GLFWwindow* window;
    GLFWmonitor* monitor = NULL;

    if (!glfwInit())
    {
        fprintf(stderr, "Failed to initialize GLFW\n");
        exit(EXIT_FAILURE);
    }

    while ((ch = getopt(argc, argv, "fh")) != -1)
    {
        switch (ch)
        {
            case 'f':
                monitor = glfwGetPrimaryMonitor();
                break;
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
        }
    }

    if (monitor)
    {
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);

        glfwWindowHint(GLFW_RED_BITS, mode->redBits);
        glfwWindowHint(GLFW_GREEN_BITS, mode->greenBits);
        glfwWindowHint(GLFW_BLUE_BITS, mode->blueBits);
        glfwWindowHint(GLFW_REFRESH_RATE, mode->refreshRate);

        width  = mode->width;
        height = mode->height;
    }
    else
    {
        width  = 640;
        height = 480;
    }

    window = glfwCreateWindow(width, height, "Particle Engine", monitor, NULL);
    if (!window)
    {
        fprintf(stderr, "Failed to create GLFW window\n");
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    if (monitor)
        glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_DISABLED);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    glfwSetFramebufferSizeCallback(window, resize_callback);
    glfwSetKeyCallback(window, key_callback);

    // Set initial aspect ratio
    glfwGetFramebufferSize(window, &width, &height);
    resize_callback(window, width, height);

    // Upload particle texture
    glGenTextures(1, &particle_tex_id);
    glBindTexture(GL_TEXTURE_2D, particle_tex_id);
    glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_LUMINANCE, P_TEX_WIDTH, P_TEX_HEIGHT,
                 0, GL_LUMINANCE, GL_UNSIGNED_BYTE, particle_texture);

    // Upload floor texture
    glGenTextures(1, &floor_tex_id);
    glBindTexture(GL_TEXTURE_2D, floor_tex_id);
    glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_LUMINANCE, F_TEX_WIDTH, F_TEX_HEIGHT,
                 0, GL_LUMINANCE, GL_UNSIGNED_BYTE, floor_texture);

    if (glfwExtensionSupported("GL_EXT_separate_specular_color"))
    {
        glLightModeli(GL_LIGHT_MODEL_COLOR_CONTROL_EXT,
                      GL_SEPARATE_SPECULAR_COLOR_EXT);
    }

    // Set filled polygon mode as default (not wireframe)
    glPolygonMode(GL_FRONT_AND_BACK, GL_FILL);
    wireframe = 0;

    // Set initial times
    thread_sync.t  = 0.0;
    thread_sync.dt = 0.001f;
    thread_sync.p_frame = 0;
    thread_sync.d_frame = 0;

    mtx_init(&thread_sync.particles_lock, mtx_timed);
    cnd_init(&thread_sync.p_done);
    cnd_init(&thread_sync.d_done);

    if (thrd_create(&physics_thread, physics_thread_main, window) != thrd_success)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetTime(0.0);

    while (!glfwWindowShouldClose(window))
    {
        draw_scene(window, glfwGetTime());

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    thrd_join(physics_thread, NULL);

    glfwDestroyWindow(window);
    glfwTerminate();

    exit(EXIT_SUCCESS);
}